

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdGetPubkeyFromPrivkey(void *handle,char *privkey,char *wif,bool is_compressed,char **pubkey)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  KeyApi api;
  string key;
  allocator local_92;
  KeyApi local_91;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  string local_50;
  
  cfd::Initialize();
  if (pubkey == (char **)0x0) {
    local_90._0_8_ = "cfdcapi_key.cpp";
    local_90._8_4_ = 0x4a2;
    local_80._M_allocated_capacity = 0x5e31a8;
    cfd::core::logger::log<>((CfdSourceLocation *)local_90,kCfdLogLevelWarning,"pubkey is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_90._0_8_ = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"Failed to parameter. pubkey is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_90);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(privkey);
  if (bVar1) {
    bVar1 = cfd::capi::IsEmptyString(wif);
    if (bVar1) {
      local_90._0_8_ = "cfdcapi_key.cpp";
      local_90._8_4_ = 0x4a8;
      local_80._M_allocated_capacity = 0x5e31a8;
      cfd::core::logger::log<>
                ((CfdSourceLocation *)local_90,kCfdLogLevelWarning,"privkey is null or empty.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      local_90._0_8_ = &local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,"Failed to parameter. privkey is null or empty.","");
      cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_90);
      __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
  }
  local_90._8_8_ = 0;
  local_80._M_allocated_capacity = local_80._M_allocated_capacity & 0xffffffffffffff00;
  local_90._0_8_ = &local_80;
  bVar1 = cfd::capi::IsEmptyString(wif);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_70,privkey,&local_92);
    cfd::api::KeyApi::GetPubkeyFromPrivkey(&local_50,&local_91,&local_70,is_compressed);
  }
  else {
    std::__cxx11::string::string((string *)&local_70,wif,&local_92);
    cfd::api::KeyApi::GetPubkeyFromPrivkey(&local_50,&local_91,&local_70,is_compressed);
  }
  std::__cxx11::string::operator=((string *)local_90,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pcVar2 = cfd::capi::CreateString((string *)local_90);
  *pubkey = pcVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._0_8_ != &local_80) {
    operator_delete((void *)local_90._0_8_);
  }
  return 0;
}

Assistant:

int CfdGetPubkeyFromPrivkey(
    void* handle, const char* privkey, const char* wif, bool is_compressed,
    char** pubkey) {
  try {
    cfd::Initialize();
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }
    if (IsEmptyString(privkey) && IsEmptyString(wif)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }

    KeyApi api;
    std::string key;
    if (!IsEmptyString(wif)) {
      key = api.GetPubkeyFromPrivkey(wif, is_compressed);
    } else {
      key = api.GetPubkeyFromPrivkey(privkey, is_compressed);
    }
    *pubkey = CreateString(key);

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}